

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O0

torrent_handle __thiscall
libtorrent::session_handle::
sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::digest32<160l>const&),libtorrent::digest32<160l>const&>
          (session_handle *this,offset_in_session_impl_to_subr f,digest32<160L> *a)

{
  bool bVar1;
  element_type *peVar2;
  io_context *ctx;
  __weak_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  torrent_handle tVar3;
  undefined1 auVar4 [12];
  undefined1 local_c8 [8];
  undefined1 local_c0 [64];
  uint auStack_80 [2];
  uint local_78;
  exception_ptr local_70;
  exception_ptr ex;
  bool done;
  error_code_enum local_54;
  undefined1 local_50 [8];
  shared_ptr<libtorrent::aux::session_impl> s;
  digest32<160L> *a_local;
  offset_in_session_impl_to_subr f_local;
  session_handle *this_local;
  torrent_handle *r;
  
  s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_R8;
  ::std::weak_ptr<libtorrent::aux::session_impl>::lock
            ((weak_ptr<libtorrent::aux::session_impl> *)local_50);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
  if (!bVar1) {
    local_54 = invalid_session_handle;
    libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              (&local_54);
  }
  ex._M_exception_object._3_1_ = 0;
  ex._M_exception_object._2_1_ = 0;
  torrent_handle::torrent_handle((torrent_handle *)this);
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_70);
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  ctx = libtorrent::aux::session_impl::get_context(peVar2);
  local_c0._8_8_ = (long)&ex._M_exception_object + 3;
  local_c0._0_8_ = this;
  local_c0._16_8_ = &local_70;
  ::std::shared_ptr<libtorrent::aux::session_impl>::shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)(local_c0 + 0x18),
             (shared_ptr<libtorrent::aux::session_impl> *)local_50);
  local_78 = *(uint *)&s.
                       super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi[1]._vptr__Sp_counted_base;
  local_c0._56_8_ =
       (s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi)->_vptr__Sp_counted_base;
  auStack_80[0] =
       (s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi)->_M_use_count;
  auStack_80[1] =
       (s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi)->_M_weak_count;
  local_c0._40_8_ = a;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::session_handle::sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::digest32<160l>const&),libtorrent::digest32<160l>const&>(libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::digest32<160l>const&),libtorrent::digest32<160l>const&)const::_lambda()_1_>
            (ctx,(type_conflict *)local_c0,(type *)0x0);
  const::{lambda()#1}::~sync_call_ret((_lambda___1_ *)local_c0);
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_50);
  libtorrent::aux::torrent_wait((bool *)((long)&ex._M_exception_object + 3),peVar2);
  bVar1 = ::std::__exception_ptr::exception_ptr::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    ex._M_exception_object._2_1_ = 1;
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_70);
    if ((ex._M_exception_object._2_1_ & 1) == 0) {
      torrent_handle::~torrent_handle((torrent_handle *)this);
    }
    ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
              ((shared_ptr<libtorrent::aux::session_impl> *)local_50);
    tVar3.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    tVar3.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (torrent_handle)
           tVar3.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)local_c8,&local_70);
  auVar4 = ::std::rethrow_exception((exception_ptr)local_c8);
  ex._M_exception_object._4_4_ = auVar4._8_4_;
  const::{lambda()#1}::~sync_call_ret((_lambda___1_ *)local_c0);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_70);
  torrent_handle::~torrent_handle((torrent_handle *)this);
  ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)local_50);
  _Unwind_Resume(auVar4._0_8_);
}

Assistant:

Ret session_handle::sync_call_ret(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;
		Ret r;
		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &r, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
		return r;
	}